

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

uint32_t bf_get_uint32_le(bfile_t *bfile)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  bfile_t *in_RDI;
  uint32_t val;
  
  uVar1 = bf_get_uint8(in_RDI);
  uVar2 = bf_get_uint8(in_RDI);
  uVar3 = bf_get_uint8(in_RDI);
  uVar4 = bf_get_uint8(in_RDI);
  return CONCAT13(uVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
}

Assistant:

uint32_t
bf_get_uint32_le(
    bfile_t * bfile )
{
    uint32_t val;
    val = bf_get_uint8( bfile );
    val |= bf_get_uint8( bfile ) << 8;
    val |= bf_get_uint8( bfile ) << 16;
    val |= bf_get_uint8( bfile ) << 24;
    return val;
}